

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O0

LispPTR N_OP_iremainder(LispPTR tosm1,LispPTR tos)

{
  float fVar1;
  ushort uVar2;
  LispPTR LVar3;
  LispPTR *pLVar4;
  float *pfVar5;
  uint *NAddr;
  uint uVar6;
  int *fixpp;
  float temp_1;
  float temp;
  int result;
  int arg2;
  int arg1;
  LispPTR tos_local;
  LispPTR tosm1_local;
  
  if ((tosm1 & 0xfff0000) == 0xe0000) {
    result = tosm1 & 0xffff;
  }
  else if ((tosm1 & 0xfff0000) == 0xf0000) {
    result = tosm1 | 0xffff0000;
  }
  else {
    uVar2 = *(ushort *)((ulong)(MDStypetbl + (tosm1 >> 9)) ^ 2) & 0x7ff;
    if (uVar2 == 2) {
      pLVar4 = NativeAligned4FromLAddr(tosm1);
      result = *pLVar4;
    }
    else {
      if (uVar2 != 3) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pfVar5 = (float *)NativeAligned4FromLAddr(tosm1);
      fVar1 = *pfVar5;
      if (2.1474836e+09 < fVar1) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if (fVar1 < 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      result = (int)fVar1;
    }
  }
  if ((tos & 0xfff0000) == 0xe0000) {
    temp = (float)(tos & 0xffff);
  }
  else if ((tos & 0xfff0000) == 0xf0000) {
    temp = (float)(tos | 0xffff0000);
  }
  else {
    uVar2 = *(ushort *)((ulong)(MDStypetbl + (tos >> 9)) ^ 2) & 0x7ff;
    if (uVar2 == 2) {
      pfVar5 = (float *)NativeAligned4FromLAddr(tos);
      temp = *pfVar5;
    }
    else {
      if (uVar2 != 3) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pfVar5 = (float *)NativeAligned4FromLAddr(tos);
      fVar1 = *pfVar5;
      if (2.1474836e+09 < fVar1) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if (fVar1 < 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      temp = (float)(int)fVar1;
    }
  }
  if (temp == 0.0) {
    MachineState.errorexit = 1;
    MachineState.tosvalue = tos;
    return 0xffffffff;
  }
  uVar6 = result % (int)temp;
  if (uVar6 >> 0x10 != 0xffff) {
    if (uVar6 >> 0x10 != 0) {
      NAddr = (uint *)createcell68k(2);
      *NAddr = uVar6;
      LVar3 = LAddrFromNative(NAddr);
      return LVar3;
    }
    return uVar6 | 0xe0000;
  }
  return uVar6 & 0xffff | 0xf0000;
}

Assistant:

LispPTR N_OP_iremainder(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;
  int result;

  N_IGETNUMBER(tosm1, arg1, doufn);
  N_IGETNUMBER(tos, arg2, doufn);
  if (arg2 == 0) goto doufn;

  result = arg1 % arg2;
  N_ARITH_SWITCH(result);

doufn:
  ERROR_EXIT(tos);

}